

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::builtins::CountDriversFunc::bindArgument
          (CountDriversFunc *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *param_4)

{
  Type *rhs;
  int iVar1;
  SourceLocation location;
  Expression *pEVar2;
  undefined4 extraout_var;
  Token local_28;
  
  if (argIndex != 0) {
    rhs = ((context->scope).ptr)->compilation->intType;
    local_28 = slang::syntax::SyntaxNode::getFirstToken(&syntax->super_SyntaxNode);
    location = parsing::Token::location(&local_28);
    pEVar2 = Expression::bindLValue(syntax,rhs,location,context,false);
    return pEVar2;
  }
  iVar1 = Expression::bind((int)syntax,(sockaddr *)context,0);
  return (Expression *)CONCAT44(extraout_var,iVar1);
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args&) const final {
        if (argIndex > 0) {
            return Expression::bindLValue(syntax, context.getCompilation().getIntType(),
                                          syntax.getFirstToken().location(), context,
                                          /* isInout */ false);
        }
        return Expression::bind(syntax, context);
    }